

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_set_ext_ref_ptr(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  long *plVar2;
  aom_image_t *img;
  undefined8 *puVar3;
  av1_ext_ref_frame_t *ext_frames;
  long lVar4;
  aom_codec_err_t aVar5;
  YV12_BUFFER_CONFIG *yv12;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar3 + 1;
  }
  plVar2 = (long *)*puVar3;
  if (plVar2 == (long *)0x0) {
    aVar5 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    lVar4 = plVar2[1];
    (ctx->ext_refs).num = (int)lVar4;
    if ((int)lVar4 < 1) {
      aVar5 = AOM_CODEC_OK;
    }
    else {
      yv12 = (ctx->ext_refs).refs;
      aVar5 = AOM_CODEC_OK;
      lVar4 = 0;
      do {
        img = (aom_image_t *)*plVar2;
        *plVar2 = (long)(img + 1);
        image2yuvconfig(img,yv12);
        lVar4 = lVar4 + 1;
        yv12 = yv12 + 1;
      } while (lVar4 < (ctx->ext_refs).num);
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_set_ext_ref_ptr(aom_codec_alg_priv_t *ctx,
                                            va_list args) {
  av1_ext_ref_frame_t *const data = va_arg(args, av1_ext_ref_frame_t *);

  if (data) {
    av1_ext_ref_frame_t *const ext_frames = data;
    ctx->ext_refs.num = ext_frames->num;
    for (int i = 0; i < ctx->ext_refs.num; i++) {
      image2yuvconfig(ext_frames->img++, &ctx->ext_refs.refs[i]);
    }
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}